

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.h
# Opt level: O3

size_t __thiscall
xmrig::Threads<xmrig::CpuThreads>::move
          (Threads<xmrig::CpuThreads> *this,char *profile,CpuThreads *threads)

{
  pointer pCVar1;
  pointer pCVar2;
  const_iterator cVar3;
  size_t sVar4;
  pair<const_xmrig::String,_xmrig::CpuThreads> local_68;
  
  String::String(&local_68.first,"cn/blur");
  cVar3 = std::
          _Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::CpuThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
          ::find((_Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::CpuThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
                  *)this,&local_68.first);
  if (local_68.first.m_data != (char *)0x0) {
    operator_delete__(local_68.first.m_data);
  }
  if ((_Rb_tree_header *)cVar3._M_node == &(this->m_profiles)._M_t._M_impl.super__Rb_tree_header) {
    pCVar1 = (threads->m_data).
             super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar2 = (threads->m_data).
             super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = (long)pCVar1 - (long)pCVar2 >> 4;
    if (pCVar1 != pCVar2) {
      String::String(&local_68.first,profile);
      local_68.second.m_format = threads->m_format;
      local_68.second._4_4_ = *(undefined4 *)&threads->field_0x4;
      local_68.second.m_affinity = threads->m_affinity;
      local_68.second.m_data.super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (threads->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_68.second.m_data.super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (threads->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68.second.m_data.super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (threads->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (threads->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (threads->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (threads->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::CpuThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::CpuThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::CpuThreads>>>
      ::_M_insert_unique<std::pair<xmrig::String_const,xmrig::CpuThreads>>
                ((_Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::CpuThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::CpuThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::CpuThreads>>>
                  *)this,&local_68);
      if (local_68.second.m_data.
          super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.second.m_data.
                        super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68.first.m_data != (char *)0x0) {
        operator_delete__(local_68.first.m_data);
      }
    }
  }
  else {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

inline size_t move(const char *profile, T &&threads)
    {
        if (has()) {
            return 0;
        }

        const size_t count = threads.count();

        if (!threads.isEmpty()) {
            m_profiles.insert({ profile, std::move(threads) });
        }

        return count;
    }